

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_get_expr_minmax
              (fitsfile *fptr,char *expr,double *datamin,double *datamax,int *datatype,int *status)

{
  int iVar1;
  double *in_RCX;
  double *in_RDX;
  long unaff_RBX;
  void *in_RSI;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *in_RDI;
  int *in_R8;
  parseInfo *in_R9;
  double dVar2;
  iteratorCol *unaff_retaddr;
  int in_stack_00000008;
  int *in_stack_00000020;
  double double_nulval;
  char tdimKwd [9];
  char nullKwd [9];
  char tform [16];
  char card [81];
  Node *result;
  int colNo;
  int col_cnt;
  long nrows;
  long width;
  long repeat;
  long naxes [5];
  long nelem;
  int newNullKwd;
  int typecode;
  int constant;
  int naxis;
  histo_minmax_workfn_struct minmaxWorkFn;
  ParseData lParse;
  parseInfo Info;
  int *status_00;
  ParseData *lParse_00;
  undefined1 *nrows_00;
  int *in_stack_fffffffffffffd10;
  parseInfo *Info_00;
  ParseData *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  char *keyname;
  int in_stack_fffffffffffffd34;
  fitsfile *in_stack_fffffffffffffd38;
  long *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  fitsfile *in_stack_fffffffffffffda8;
  int *in_stack_fffffffffffffdc0;
  long *in_stack_fffffffffffffdc8;
  ParseData *in_stack_fffffffffffffdd0;
  fitsfile *in_stack_fffffffffffffdd8;
  long local_1f8;
  int local_1e4;
  int *local_1e0;
  double local_1d8;
  double local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined1 local_1b8 [56];
  DataInfo *local_180;
  int local_170;
  int local_d0 [10];
  undefined1 *local_a8;
  parseInfo *local_40;
  int *local_38;
  double *local_30;
  double *local_28;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  keyname = (char *)0xb8a83e285ebab4b7;
  if (in_R9->datatype == 0) {
    local_40 = in_R9;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_28 = in_RDX;
    memset(&local_1e0,0,0x28);
    memset(local_d0,0,0x90);
    memset(local_1b8,0,0xe8);
    if (local_38 != (int *)0x0) {
      *local_38 = 0;
    }
    ffgky(in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,keyname,
          (void *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
          (char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    lParse_00 = (ParseData *)&stack0xfffffffffffffdd8;
    status_00 = &local_1e4;
    nrows_00 = local_1b8;
    Info_00 = local_40;
    iVar1 = ffiprs(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,
                   in_stack_fffffffffffffd94,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,
                   &in_stack_fffffffffffffdd8->HDUposition);
    if (iVar1 == 0) {
      if (local_38 != (int *)0x0) {
        *local_38 = local_d0[0];
      }
      if (local_1f8 < 0) {
        if (local_d0[0] == 1) {
          dVar2 = (double)(*(char *)((long)local_180 + (long)local_170 * 0x180 + 0x80) != '\0');
          *local_30 = dVar2;
          *local_28 = dVar2;
        }
        else if (local_d0[0] == 0xe) {
          dVar2 = (double)(*(char *)((long)local_180 + (long)local_170 * 0x180 + 0x80) == '\x01');
          *local_30 = dVar2;
          *local_28 = dVar2;
        }
        else if (local_d0[0] == 0x29) {
          dVar2 = (double)*(long *)((long)local_180 + (long)local_170 * 0x180 + 0x80);
          *local_30 = dVar2;
          *local_28 = dVar2;
        }
        else if (local_d0[0] == 0x52) {
          dVar2 = *(double *)((long)local_180 + (long)local_170 * 0x180 + 0x80);
          *local_30 = dVar2;
          *local_28 = dVar2;
        }
        ffcprs(lParse_00);
        iVar1 = local_40->datatype;
      }
      else {
        local_a8 = local_1b8;
        iVar1 = fits_parser_set_temporary_col
                          (in_stack_fffffffffffffd18,Info_00,(long)nrows_00,lParse_00,status_00);
        if (iVar1 == 0) {
          local_1e0 = local_d0;
          local_1d0 = -9.1191291391491e-36;
          local_1d8 = -9.1191291391491e-36;
          local_1c0 = 0;
          local_1c8._0_4_ = 0;
          local_1c8._4_4_ = 0;
          iVar1 = ffiter(in_stack_00000008,unaff_retaddr,unaff_RBX,
                         CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI,in_RSI
                         ,in_stack_00000020);
          if (iVar1 == -1) {
            local_40->datatype = 0;
          }
          if (local_28 != (double *)0x0) {
            *local_28 = local_1d8;
          }
          if (local_30 != (double *)0x0) {
            *local_30 = local_1d0;
          }
          ffcprs(lParse_00);
          iVar1 = local_40->datatype;
        }
        else {
          ffcprs(lParse_00);
          iVar1 = local_40->datatype;
        }
      }
    }
    else {
      ffcprs(lParse_00);
      iVar1 = local_40->datatype;
    }
  }
  else {
    iVar1 = in_R9->datatype;
  }
  return iVar1;
}

Assistant:

int fits_get_expr_minmax(fitsfile *fptr, char *expr, double *datamin, 
			 double *datamax, int *datatype, int *status)
/* 
   Simple utility routine to compute the min and max value in an expression
*/
{
   parseInfo Info;
   ParseData lParse;
   struct histo_minmax_workfn_struct minmaxWorkFn;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width, nrows;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   double double_nulval = DOUBLENULLVALUE;

   if( *status ) return( *status );

   memset(&minmaxWorkFn, 0, sizeof(minmaxWorkFn));
   memset(&Info, 0, sizeof(Info));
   memset(&lParse, 0, sizeof(lParse));
   if (datatype) *datatype = 0;

   ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }

   if (datatype) *datatype = Info.datatype;

   if( nelem<0 ) { /* Constant already computed */
      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE: *datamin = *datamax = result->value.data.dbl; break;
      case TLONG:   *datamin = *datamax = (double) result->value.data.lng; break;
      case TLOGICAL:*datamin = *datamax = (double) ((result->value.data.log == 1)?1:0); break;
      case TBIT:    *datamin = *datamax = (double) ((result->value.data.str[0])?1:0); break;
      }
      ffcprs(&lParse);
      return( *status );
   }

   Info.parseData = &lParse;

   /* Add a temporary column which contains the expression value */
   if ( fits_parser_set_temporary_col( &lParse, &Info, nrows, &double_nulval, status) ) {
     ffcprs(&lParse);
     return( *status );
   }

   /* Initialize the work function computing min/max */
   minmaxWorkFn.Info = &Info;
   minmaxWorkFn.datamin = minmaxWorkFn.datamax = DOUBLENULLVALUE;
   minmaxWorkFn.ntotal = minmaxWorkFn.ngood = 0;
   
   if( ffiter( lParse.nCols, lParse.colData, 0, 0,
	       histo_minmax_expr_workfn, (void*)&minmaxWorkFn, status ) == -1 )
     *status = 0;  /* -1 indicates exitted without error before end... OK */

   if (datamin) *datamin = minmaxWorkFn.datamin;
   if (datamax) *datamax = minmaxWorkFn.datamax;

   ffcprs(&lParse);
   return(*status);

}